

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O3

void __thiscall HeapProfileTable::SaveProfile(HeapProfileTable *this,GenericWriter *writer)

{
  Bucket *b;
  int i;
  long lVar1;
  
  tcmalloc::GenericWriter::AppendMem(writer,"heap profile: ",0xe);
  UnparseBucket(&this->total_,writer," heapprofile");
  lVar1 = 0;
  do {
    for (b = this->bucket_table_[lVar1]; b != (Bucket *)0x0; b = b->next) {
      UnparseBucket(b,writer,"");
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 179999);
  tcmalloc::GenericWriter::AppendMem(writer,"\nMAPPED_LIBRARIES:\n",0x13);
  tcmalloc::SaveProcSelfMaps(writer);
  return;
}

Assistant:

void HeapProfileTable::SaveProfile(tcmalloc::GenericWriter* writer) const {
  writer->AppendStr(kProfileHeader);
  UnparseBucket(total_, writer, " heapprofile");

  int bucket_count = 0;
  for (int i = 0; i < kHashTableSize; i++) {
    for (Bucket* curr = bucket_table_[i]; curr != nullptr; curr = curr->next) {
      UnparseBucket(*curr, writer, "");
      bucket_count++;
    }
  }
  RAW_DCHECK(bucket_count == num_buckets_, "");
  (void)bucket_count;

  writer->AppendStr(kProcSelfMapsHeader);
  tcmalloc::SaveProcSelfMaps(writer);
}